

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

int startofsecdef(lword *s_addr,char *s_type,lword *s_lma)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  lword current_addr;
  undefined8 uStack_40;
  
  if (current_ls == (LinkedSection *)0x0) {
    current_addr = -2;
  }
  else {
    current_addr = current_ls->relocmem->current;
  }
  *s_type = '\0';
  cVar2 = getchr();
  iVar7 = 1;
  if (cVar2 == '(') {
LAB_00112a15:
    pcVar5 = getword();
    if (pcVar5 == (char *)0x0) goto LAB_00112ab7;
    strcpy(s_type,pcVar5);
    cVar2 = getchr();
    pcVar5 = scriptname;
    if (cVar2 != ')') {
      uVar3 = getlineno();
      iVar7 = 0;
      error(0x42,pcVar5,(ulong)uVar3,0x29);
      back(1);
    }
    cVar2 = getchr();
LAB_00112a64:
    if (cVar2 != ':') {
LAB_00112ab7:
      pcVar5 = scriptname;
      uVar3 = getlineno();
      error(0x42,pcVar5,(ulong)uVar3,0x3a);
      back(1);
      return 0;
    }
  }
  else if (cVar2 != ':') {
    back(1);
    parse_expr(current_addr,s_addr);
    cVar2 = getchr();
    iVar7 = 3;
    if (cVar2 == '(') goto LAB_00112a15;
    goto LAB_00112a64;
  }
  pcVar6 = getword();
  pcVar5 = scriptname;
  if (pcVar6 != (char *)0x0) {
    if (((*pcVar6 == 'A') && (pcVar6[1] == 'T')) && (pcVar6[2] == '\0')) {
      cVar2 = getchr();
      pcVar5 = scriptname;
      if (cVar2 == '(') {
        parse_expr(current_addr,s_lma);
        iVar1 = iVar7 + 4;
        if (iVar7 == 0) {
          iVar1 = iVar7;
        }
        iVar7 = iVar1;
        cVar2 = getchr();
        pcVar5 = scriptname;
        if (cVar2 == ')') goto LAB_00112aa8;
        uVar3 = getlineno();
        uStack_40 = 0x29;
      }
      else {
        uVar3 = getlineno();
        uStack_40 = 0x28;
      }
      iVar7 = 0;
      error(0x42,pcVar5,(ulong)uVar3,uStack_40);
      back(1);
    }
    else {
      uVar3 = getlineno();
      error(0x41,pcVar5,(ulong)uVar3,pcVar6);
    }
  }
LAB_00112aa8:
  bVar4 = startofblock('{');
  if (bVar4 == 0) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int startofsecdef(lword *s_addr,char *s_type,lword *s_lma)
/* Parse syntax of section definition until '{' and return VMA address,
   LMA address and type, when given.
   Returns bitfield. 0 when syntax is incorrect, 1 for correct,
   3 for s_addr set, 5 for s_lma set and 7 for both.
   Syntax: [addr-expr] [(type)] : [AT(lma)] { */
{
  int ret = 1;
  lword caddr = -2; /* this prevents expression evaluation during pre-parse */
  char *buf,c;

  if (current_ls)
    caddr = current_ls->relocmem->current;

  *s_type = 0;

  c = getchr();
  if (c != ':') {
    if (c != '(') {
      back(1);
      parse_expr(caddr,s_addr);
#if 0 /* @@@ not needed? address must be within memory region */
      if (current_ls) {
        if (current_ls->relocmem != defmem) {
          /* warning: address overrides specified VMA memory region */
          error(76,scriptname,getlineno(),'V');
          current_ls->relocmem = defmem;
        }
      }
#endif
      ret |= 2;
      c = getchr();
    }
    if (c == '(') {
      if (buf = getword()) {
        strcpy(s_type,buf);
        if (getchr() != ')') {
          error(66,scriptname,getlineno(),')');  /* ')' expected */
          back(1);
          ret = 0;
        }
        c = getchr();
      }
    }
  }

  if (c != ':') {
    error(66,scriptname,getlineno(),':');  /* ':' expected */
    back(1);
    return 0;
  }

  if (buf = getword()) {
    if (!strcmp(buf,"AT")) {
      if (getchr()=='(') {
        parse_expr(caddr,s_lma);
#if 0 /* @@@ not needed? address must be within memory region */
        if (current_ls) {
          if (current_ls->destmem != defmem) {
            if (current_ls->destmem != current_ls->relocmem) {
              /* warning: address overrides specified LMA memory region */
              error(76,scriptname,getlineno(),'L');
            }
            current_ls->destmem = atdefmem;
          }
        }
#endif
        if (ret)
          ret |= 4;
        if (getchr() != ')') {
          error(66,scriptname,getlineno(),')');  /* ')' expected */
          back(1);
          ret = 0;
        }
      }
      else {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        ret = 0;
      }
    }
    else
      error(65,scriptname,getlineno(),buf);  /* unknown keyword ignored */
  }

  if (!startofblock('{'))
    ret = 0;

  return ret;
}